

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int little2_scanPercent(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  ulong uVar5;
  
  uVar5 = (long)end - (long)ptr;
  if ((long)uVar5 < 2) {
    return -1;
  }
  bVar1 = ptr[1];
  iVar4 = 0;
  if (bVar1 < 0xdc) {
    if (bVar1 - 0xd8 < 4) {
LAB_0074a116:
      iVar4 = 0;
      if (uVar5 < 4) {
        return -2;
      }
      goto switchD_0074a171_caseD_17;
    }
    if (bVar1 == 0) {
      bVar2 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      if (0x14 < bVar2) {
        switch(bVar2) {
        case 0x15:
        case 0x1e:
          goto switchD_0074a171_caseD_15;
        case 0x16:
        case 0x18:
          goto switchD_0074a171_caseD_16;
        default:
          goto switchD_0074a171_caseD_17;
        case 0x1d:
          goto switchD_0074a171_caseD_1d;
        }
      }
      if (1 < bVar2 - 9) {
        if (bVar2 == 6) {
          if (uVar5 == 2) {
            return -2;
          }
          goto switchD_0074a171_caseD_17;
        }
        if (bVar2 != 7) goto switchD_0074a171_caseD_17;
        goto LAB_0074a116;
      }
switchD_0074a171_caseD_15:
      iVar4 = 0x16;
      goto switchD_0074a171_caseD_17;
    }
  }
  else if ((bVar1 - 0xdc < 4) || ((bVar1 == 0xff && (0xfd < (byte)*ptr))))
  goto switchD_0074a171_caseD_17;
switchD_0074a171_caseD_1d:
  if ((*(uint *)((long)namingBitmap +
                (ulong)((byte)*ptr >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >>
       ((byte)*ptr & 0x1f) & 1) != 0) {
switchD_0074a171_caseD_16:
    ptr = ptr + 2;
    uVar5 = (long)end - (long)ptr;
    while( true ) {
      if ((long)uVar5 < 2) {
        return -1;
      }
      bVar1 = ((byte *)ptr)[1];
      if (bVar1 < 0xdc) break;
      if (bVar1 == 0xff) {
        if (0xfd < (byte)*ptr) goto switchD_0074a171_caseD_17;
      }
      else if (bVar1 - 0xdc < 4) goto switchD_0074a171_caseD_17;
switchD_0074a211_caseD_1d:
      if ((*(uint *)((long)namingBitmap +
                    (ulong)((byte)*ptr >> 3 & 0x1c |
                           (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >> ((byte)*ptr & 0x1f)
          & 1) == 0) goto switchD_0074a171_caseD_17;
switchD_0074a211_caseD_16:
      ptr = (char *)((byte *)ptr + 2);
      uVar5 = uVar5 - 2;
    }
    if (bVar1 != 0) {
      if (bVar1 - 0xd8 < 4) goto LAB_0074a2cf;
      goto switchD_0074a211_caseD_1d;
    }
    cVar3 = *(char *)((long)enc[1].scanners + (ulong)(byte)*ptr);
    switch(cVar3) {
    case '\x12':
      ptr = (char *)((byte *)ptr + 2);
      iVar4 = 0x1c;
    case '\x13':
    case '\x14':
    case '\x15':
    case '\x17':
    case '\x1c':
      break;
    case '\x16':
    case '\x18':
    case '\x19':
    case '\x1a':
    case '\x1b':
      goto switchD_0074a211_caseD_16;
    case '\x1d':
      goto switchD_0074a211_caseD_1d;
    default:
      if (cVar3 == '\x06') {
        if (uVar5 == 2) {
          return -2;
        }
      }
      else if (cVar3 == '\a') {
LAB_0074a2cf:
        if (uVar5 < 4) {
          return -2;
        }
      }
    }
  }
switchD_0074a171_caseD_17:
  *nextTokPtr = ptr;
  return iVar4;
}

Assistant:

static int PTRCALL
PREFIX(scanPercent)(const ENCODING *enc, const char *ptr, const char *end,
                    const char **nextTokPtr) {
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_S:
  case BT_LF:
  case BT_CR:
  case BT_PERCNT:
    *nextTokPtr = ptr;
    return XML_TOK_PERCENT;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_PARAM_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}